

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.cc
# Opt level: O0

ostream * absl::lts_20240722::time_internal::cctz::detail::operator<<(ostream *os,civil_hour *h)

{
  civil_hour *pcVar1;
  int iVar2;
  ostream *poVar3;
  string local_1e8 [36];
  int local_1c4;
  char local_1bd;
  civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> local_1b0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  civil_time<absl::lts_20240722::time_internal::cctz::detail::hour_tag> *local_18;
  civil_hour *h_local;
  ostream *os_local;
  
  local_18 = h;
  h_local = (civil_hour *)os;
  std::__cxx11::stringstream::stringstream(local_1a0);
  civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag>::
  civil_time<absl::lts_20240722::time_internal::cctz::detail::hour_tag>
            (&local_1b0,local_18,
             (preserves_data<absl::lts_20240722::time_internal::cctz::detail::hour_tag,_absl::lts_20240722::time_internal::cctz::detail::day_tag>
              *)0x0);
  poVar3 = operator<<(local_190,&local_1b0);
  std::operator<<(poVar3,'T');
  local_1bd = (char)std::setfill<char>('0');
  poVar3 = std::operator<<(local_190,local_1bd);
  local_1c4 = (int)std::setw(2);
  poVar3 = std::operator<<(poVar3,(_Setw)local_1c4);
  iVar2 = civil_time<absl::lts_20240722::time_internal::cctz::detail::hour_tag>::hour(local_18);
  std::ostream::operator<<(poVar3,iVar2);
  pcVar1 = h_local;
  std::__cxx11::stringstream::str();
  poVar3 = std::operator<<((ostream *)pcVar1,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const civil_hour& h) {
  std::stringstream ss;
  ss << civil_day(h) << 'T';
  ss << std::setfill('0') << std::setw(2) << h.hour();
  return os << ss.str();
}